

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console_Command.h
# Opt level: O1

void __thiscall
Generic_Command_As_Console_Command<RehashGenericCommand>::trigger
          (Generic_Command_As_Console_Command<RehashGenericCommand> *this,string_view parameters)

{
  ResponseLine *pRVar1;
  ResponseLine *__ptr_00;
  pointer *__ptr;
  ostream *poVar2;
  bool bVar3;
  unique_ptr<Jupiter::GenericCommand::ResponseLine,_std::default_delete<Jupiter::GenericCommand::ResponseLine>_>
  response_line;
  ResponseLine *local_28;
  
  local_28 = (ResponseLine *)
             (**(code **)(RehashGenericCommand_instance.super_RehashGenericCommand._0_8_ + 0x18))
                       (&RehashGenericCommand_instance,parameters._M_len,parameters._M_str);
  while (local_28 != (ResponseLine *)0x0) {
    poVar2 = (ostream *)&std::cout;
    if ((*(uint *)(local_28 + 0x20) & 0xfffffffe) == 2) {
      poVar2 = (ostream *)&std::cerr;
    }
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,*(char **)local_28,*(long *)(local_28 + 8));
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    __ptr_00 = local_28;
    pRVar1 = local_28 + 0x28;
    bVar3 = local_28 != (ResponseLine *)0x0;
    local_28 = *(ResponseLine **)pRVar1;
    if (bVar3) {
      std::default_delete<Jupiter::GenericCommand::ResponseLine>::operator()
                ((default_delete<Jupiter::GenericCommand::ResponseLine> *)&local_28,__ptr_00);
    }
  }
  RehashGenericCommand_instance.super_RehashGenericCommand.super_GenericCommand =
       RehashGenericCommand_instance.super_RehashGenericCommand.super_GenericCommand;
  RehashGenericCommand_instance.super_RehashGenericCommand._1_7_ =
       RehashGenericCommand_instance.super_RehashGenericCommand._1_7_;
  return;
}

Assistant:

void Generic_Command_As_Console_Command<T>::trigger(std::string_view parameters) {
	std::unique_ptr<Jupiter::GenericCommand::ResponseLine> response_line{ T::instance.trigger(parameters) };
	while (response_line != nullptr) {
		auto& out_stream = response_line->type == Jupiter::GenericCommand::DisplayType::PublicError
			|| response_line->type == Jupiter::GenericCommand::DisplayType::PrivateError ? std::cerr : std::cout;

		out_stream << response_line->response << std::endl;
		response_line.reset(response_line->next);
	}
}